

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::EnumDescriptorProto::EnumDescriptorProto(EnumDescriptorProto *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__EnumDescriptorProto_003a0cf0
  ;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  (this->value_).
  super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->value_).
  super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->value_).
  super__Vector_base<perfetto::protos::gen::EnumValueDescriptorProto,_std::allocator<perfetto::protos::gen::EnumValueDescriptorProto>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->reserved_name_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_string_length = 0;
  (this->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w = 0;
  return;
}

Assistant:

EnumDescriptorProto::EnumDescriptorProto() = default;